

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O0

Log * __thiscall FIX::FileLogFactory::create(FileLogFactory *this,SessionID *s)

{
  bool bVar1;
  long lVar2;
  Dictionary *pDVar3;
  allocator<char> local_179;
  string local_178;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  Dictionary settings;
  string backupPath;
  string path;
  SessionID *s_local;
  FileLogFactory *this_local;
  
  lVar2 = std::__cxx11::string::size();
  if ((lVar2 == 0) || (lVar2 = std::__cxx11::string::size(), lVar2 == 0)) {
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0) {
      std::__cxx11::string::string((string *)(backupPath.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(settings.m_name.field_2._M_local_buf + 8));
      pDVar3 = SessionSettings::get(&this->m_settings,s);
      Dictionary::Dictionary((Dictionary *)local_c8,pDVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"FileLogPath",&local_109);
      Dictionary::getString(&local_e8,(Dictionary *)local_c8,&local_108,false);
      std::__cxx11::string::operator=
                ((string *)(backupPath.field_2._M_local_buf + 8),(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      std::__cxx11::string::operator=
                ((string *)(settings.m_name.field_2._M_local_buf + 8),
                 (string *)(backupPath.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"FileLogBackupPath",&local_131);
      bVar1 = Dictionary::has((Dictionary *)local_c8,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"FileLogBackupPath",&local_179);
        Dictionary::getString(&local_158,(Dictionary *)local_c8,&local_178,false);
        std::__cxx11::string::operator=
                  ((string *)(settings.m_name.field_2._M_local_buf + 8),(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator(&local_179);
      }
      this_local = (FileLogFactory *)operator_new(0x488);
      FileLog::FileLog((FileLog *)this_local,(string *)((long)&backupPath.field_2 + 8),
                       (string *)((long)&settings.m_name.field_2 + 8),s);
      Dictionary::~Dictionary((Dictionary *)local_c8);
      std::__cxx11::string::~string((string *)(settings.m_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(backupPath.field_2._M_local_buf + 8));
    }
    else {
      this_local = (FileLogFactory *)operator_new(0x488);
      FileLog::FileLog((FileLog *)this_local,&this->m_path,s);
    }
  }
  else {
    this_local = (FileLogFactory *)operator_new(0x488);
    FileLog::FileLog((FileLog *)this_local,&this->m_path,&this->m_backupPath,s);
  }
  return (Log *)this_local;
}

Assistant:

Log* FileLogFactory::create( const SessionID& s )
{
  if ( m_path.size() && m_backupPath.size() )
    return new FileLog( m_path, m_backupPath, s );
  if ( m_path.size() )
    return new FileLog( m_path, s );

  std::string path;
  std::string backupPath;
  Dictionary settings = m_settings.get( s );
  path = settings.getString( FILE_LOG_PATH );
  backupPath = path;
  if( settings.has( FILE_LOG_BACKUP_PATH ) )
    backupPath = settings.getString( FILE_LOG_BACKUP_PATH );

  return new FileLog( path, backupPath, s );
}